

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int FindHokuyoMessage(char *buf,int buflen,char **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  int *pFoundMsgTmpLen_local;
  char **pFoundMsg_local;
  int buflen_local;
  char *buf_local;
  
  *pFoundMsg = buf;
  *pFoundMsgTmpLen = buflen;
  do {
    iVar1 = AnalyzeHokuyoMessage(*pFoundMsg,*pFoundMsgTmpLen);
    if (iVar1 == 0) {
      return 0;
    }
    *pFoundMsg = *pFoundMsg + 1;
    *pFoundMsgTmpLen = *pFoundMsgTmpLen + -1;
  } while (0x1c < *pFoundMsgTmpLen);
  *pFoundMsg = (char *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindHokuyoMessage(char* buf, int buflen, char** pFoundMsg, int* pFoundMsgTmpLen)
{
	*pFoundMsg = buf;
	*pFoundMsgTmpLen = buflen;

	while (AnalyzeHokuyoMessage(*pFoundMsg, *pFoundMsgTmpLen) != EXIT_SUCCESS)
	{
		(*pFoundMsg)++;
		(*pFoundMsgTmpLen)--;
		if (*pFoundMsgTmpLen < MIN_STANDARD_BUF_LEN_HOKUYO)
		{
			*pFoundMsg = NULL;
			*pFoundMsgTmpLen = 0;
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}